

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O1

void __thiscall
icu_63::DateTimePatternGenerator::consumeShortTimePattern
          (DateTimePatternGenerator *this,UnicodeString *shortTimePattern,UErrorCode *status)

{
  short sVar1;
  uint uVar2;
  bool bVar3;
  uint uVar4;
  UChar *pUVar5;
  char16_t *pcVar6;
  ulong uVar7;
  char16_t c;
  bool bVar8;
  
  if (U_ZERO_ERROR < *status) {
    return;
  }
  sVar1 = (shortTimePattern->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    uVar4 = (shortTimePattern->fUnion).fFields.fLength;
  }
  else {
    uVar4 = (int)sVar1 >> 5;
  }
  if (0 < (int)uVar4) {
    bVar3 = false;
    uVar7 = 0;
    do {
      sVar1 = (shortTimePattern->fUnion).fStackFields.fLengthAndFlags;
      uVar2 = (int)sVar1 >> 5;
      if (sVar1 < 0) {
        uVar2 = (shortTimePattern->fUnion).fFields.fLength;
      }
      c = L'\xffff';
      if (uVar7 < uVar2) {
        pcVar6 = (char16_t *)((long)&shortTimePattern->fUnion + 2);
        if (((int)sVar1 & 2U) == 0) {
          pcVar6 = (shortTimePattern->fUnion).fFields.fArray;
        }
        c = pcVar6[uVar7];
      }
      if (c == L'\'') {
        bVar3 = !bVar3;
LAB_002ea6da:
        bVar8 = false;
      }
      else {
        if (bVar3) {
          bVar3 = true;
          goto LAB_002ea6da;
        }
        pUVar5 = u_strchr_63((UChar *)hourFormatChars,c);
        if (pUVar5 == (UChar *)0x0) {
          bVar3 = false;
          goto LAB_002ea6da;
        }
        this->fDefaultHourFormatChar = c;
        bVar8 = true;
        bVar3 = false;
      }
    } while ((!bVar8) && (bVar8 = (ulong)uVar4 - 1 != uVar7, uVar7 = uVar7 + 1, bVar8));
  }
  hackTimes(this,shortTimePattern,status);
  return;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }